

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsp.cpp
# Opt level: O0

void dlib::impl1::send_out_connection_orders
               (map_id_to_con *cons,
               vector<dlib::network_address,_std::allocator<dlib::network_address>_> *hosts)

{
  ulong uVar1;
  long *plVar2;
  size_type sVar3;
  vector<dlib::network_address,_std::allocator<dlib::network_address>_> *in_RSI;
  long *in_RDI;
  unsigned_long num;
  hostinfo info;
  unsigned_long i;
  vector<dlib::impl1::hostinfo,_std::allocator<dlib::impl1::hostinfo>_> targets;
  domain *in_stack_00000188;
  map_kernel_c<dlib::map_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::binary_search_tree_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<unsigned_long>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>
  *in_stack_00000190;
  size_type in_stack_ffffffffffffff60;
  value_type *in_stack_ffffffffffffff68;
  hostinfo *in_stack_ffffffffffffff70;
  ostream *in_stack_ffffffffffffffb8;
  vector<dlib::impl1::hostinfo,_std::allocator<dlib::impl1::hostinfo>_> *in_stack_ffffffffffffffc0;
  ulong local_30;
  vector<dlib::impl1::hostinfo,_std::allocator<dlib::impl1::hostinfo>_> local_28;
  vector<dlib::network_address,_std::allocator<dlib::network_address>_> *local_10;
  long *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  (**(code **)(*in_RDI + 0x18))();
  while( true ) {
    uVar1 = (**(code **)(*local_8 + 0x38))();
    if ((uVar1 & 1) == 0) break;
    plVar2 = (long *)(**(code **)(*local_8 + 0x30))();
    (**(code **)(*plVar2 + 0x10))();
    plVar2 = (long *)(**(code **)(*local_8 + 0x30))();
    (**(code **)(*plVar2 + 0x20))();
    std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>::operator->
              ((unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_> *)
               0x3c4b24);
    dlib::serialize((unsigned_long *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  std::vector<dlib::impl1::hostinfo,_std::allocator<dlib::impl1::hostinfo>_>::vector
            ((vector<dlib::impl1::hostinfo,_std::allocator<dlib::impl1::hostinfo>_> *)0x3c4b48);
  local_30 = 0;
  while( true ) {
    sVar3 = std::vector<dlib::network_address,_std::allocator<dlib::network_address>_>::size
                      (local_10);
    if (sVar3 <= local_30) break;
    std::vector<dlib::network_address,_std::allocator<dlib::network_address>_>::operator[]
              (local_10,local_30);
    hostinfo::hostinfo(in_stack_ffffffffffffff70,&in_stack_ffffffffffffff68->addr,
                       in_stack_ffffffffffffff60);
    in_stack_ffffffffffffff70 =
         (hostinfo *)
         map_kernel_c<dlib::map_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::binary_search_tree_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<unsigned_long>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>
         ::operator[](in_stack_00000190,in_stack_00000188);
    std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>::operator->
              ((unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_> *)
               0x3c4bc5);
    serialize<dlib::impl1::hostinfo,std::allocator<dlib::impl1::hostinfo>>
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    std::vector<dlib::impl1::hostinfo,_std::allocator<dlib::impl1::hostinfo>_>::push_back
              ((vector<dlib::impl1::hostinfo,_std::allocator<dlib::impl1::hostinfo>_> *)
               in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    in_stack_ffffffffffffff60 =
         std::vector<dlib::network_address,_std::allocator<dlib::network_address>_>::size(local_10);
    std::vector<dlib::impl1::hostinfo,_std::allocator<dlib::impl1::hostinfo>_>::size(&local_28);
    in_stack_ffffffffffffff68 =
         (value_type *)
         map_kernel_c<dlib::map_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::binary_search_tree_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<unsigned_long>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>
         ::operator[](in_stack_00000190,in_stack_00000188);
    std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>::operator->
              ((unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_> *)
               0x3c4c41);
    dlib::serialize((unsigned_long *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    map_kernel_c<dlib::map_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::binary_search_tree_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<unsigned_long>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>
    ::operator[](in_stack_00000190,in_stack_00000188);
    std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>::operator->
              ((unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_> *)
               0x3c4c75);
    std::ostream::flush();
    hostinfo::~hostinfo((hostinfo *)0x3c4c8d);
    local_30 = local_30 + 1;
  }
  std::vector<dlib::impl1::hostinfo,_std::allocator<dlib::impl1::hostinfo>_>::~vector
            ((vector<dlib::impl1::hostinfo,_std::allocator<dlib::impl1::hostinfo>_> *)
             in_stack_ffffffffffffff70);
  return;
}

Assistant:

void send_out_connection_orders (
            map_id_to_con& cons,
            const std::vector<network_address>& hosts
        )
        {
            // tell everyone their node ids
            cons.reset();
            while (cons.move_next())
            {
                dlib::serialize(cons.element().key(), cons.element().value()->stream);
            }

            // now tell them who to connect to
            std::vector<hostinfo> targets; 
            for (unsigned long i = 0; i < hosts.size(); ++i)
            {
                hostinfo info(hosts[i], i+1);

                dlib::serialize(targets, cons[info.node_id]->stream);
                targets.push_back(info);

                // let the other host know how many incoming connections to expect
                const unsigned long num = hosts.size()-targets.size();
                dlib::serialize(num, cons[info.node_id]->stream);
                cons[info.node_id]->stream.flush();
            }
        }